

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

type __thiscall
dlib::
matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::operator()(matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
             *this,long r,long c)

{
  const_ret_type pfVar1;
  long in_RDI;
  const_ret_type cVar2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  float fVar3;
  
  pfVar1 = matrix_op<dlib::op_pointer_to_mat<float>_>::operator()
                     ((matrix_op<dlib::op_pointer_to_mat<float>_> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI,0x282cbe)
  ;
  fVar3 = *pfVar1;
  cVar2 = matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
          ::operator()((matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
                        *)CONCAT44(fVar3,in_stack_ffffffffffffffe0),in_RDI,0x282ce2);
  return fVar3 - cVar2;
}

Assistant:

const type operator() (
            long r, 
            long c
        ) const { return lhs(r,c) - rhs(r,c); }